

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O2

uint32 readle32(void)

{
  uint in_EAX;
  ssize_t sVar1;
  ulong uStack_8;
  uint32 retval;
  
  uStack_8 = (ulong)in_EAX;
  if (io_failure == '\0') {
    sVar1 = read(logfd,&retval,4);
    if (sVar1 != 4) {
      IO_READ_FAIL((uint)(-1 < sVar1));
    }
  }
  return retval;
}

Assistant:

static uint32 readle32(void)
{
    uint32 retval = 0;
    if (!io_failure) {
        const ssize_t br = read(logfd, &retval, sizeof (retval));
        if (br != ((ssize_t) sizeof (retval))) {
            IO_READ_FAIL(br >= 0);
        }
    }
    return swap32(retval);
}